

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvation_energy_compute.cpp
# Opt level: O0

void __thiscall
SolvationEnergyCompute::particle_particle_interact
          (SolvationEnergyCompute *this,array<unsigned_long,_2UL> target_node_idxs,
          array<unsigned_long,_2UL> source_node_idxs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  value_type_conflict2 vVar5;
  ulong uVar6;
  reference pvVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  double *pdVar19;
  double *pdVar20;
  size_type in_RDI;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double pot_temp_2;
  double pot_temp_1;
  double L1;
  double L2;
  double expkr;
  double G0;
  double rinv;
  double r;
  double dz;
  double dy;
  double dx;
  size_t k;
  double pot_temp_dz;
  double pot_temp_dy;
  double pot_temp_dx;
  double pot_temp_dd;
  double target_z;
  double target_y;
  double target_x;
  size_t j;
  double *solv_eng_ptr;
  double *mol_q_ptr;
  double *mol_z_ptr;
  double *mol_y_ptr;
  double *mol_x_ptr;
  size_t source_node_end;
  size_t source_node_begin;
  double *potential_ptr;
  double *elem_area_ptr;
  double *elem_q_dz_ptr;
  double *elem_q_dy_ptr;
  double *elem_q_dx_ptr;
  double *elem_z_ptr;
  double *elem_y_ptr;
  double *elem_x_ptr;
  size_t target_node_end;
  size_t target_node_begin;
  array<unsigned_long,_2UL> *in_stack_fffffffffffffeb0;
  ulong local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  ulong local_b8;
  
  pvVar7 = std::array<unsigned_long,_2UL>::operator[](in_stack_fffffffffffffeb0,in_RDI);
  local_b8 = *pvVar7;
  pvVar7 = std::array<unsigned_long,_2UL>::operator[](in_stack_fffffffffffffeb0,in_RDI);
  uVar4 = *pvVar7;
  pdVar8 = Particles::x_ptr((Particles *)0x11d834);
  pdVar9 = Particles::y_ptr((Particles *)0x11d84c);
  pdVar10 = Particles::z_ptr((Particles *)0x11d864);
  pdVar11 = Elements::nx_ptr((Elements *)0x11d87c);
  pdVar12 = Elements::ny_ptr((Elements *)0x11d894);
  pdVar13 = Elements::nz_ptr((Elements *)0x11d8ac);
  pdVar14 = Elements::area_ptr((Elements *)0x11d8c4);
  pdVar15 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x11d8df);
  pvVar7 = std::array<unsigned_long,_2UL>::operator[](in_stack_fffffffffffffeb0,in_RDI);
  vVar5 = *pvVar7;
  pvVar7 = std::array<unsigned_long,_2UL>::operator[](in_stack_fffffffffffffeb0,in_RDI);
  uVar6 = *pvVar7;
  pdVar16 = Particles::x_ptr((Particles *)0x11d930);
  pdVar17 = Particles::y_ptr((Particles *)0x11d948);
  pdVar18 = Particles::z_ptr((Particles *)0x11d960);
  pdVar19 = Molecule::charge_ptr((Molecule *)0x11d978);
  pdVar20 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x11d990);
  for (; local_b8 < uVar4; local_b8 = local_b8 + 1) {
    dVar1 = pdVar8[local_b8];
    dVar2 = pdVar9[local_b8];
    dVar3 = pdVar10[local_b8];
    local_d8 = 0.0;
    local_e0 = 0.0;
    local_e8 = 0.0;
    local_f0 = 0.0;
    for (local_f8 = vVar5; local_f8 < uVar6; local_f8 = local_f8 + 1) {
      dVar21 = dVar1 - pdVar16[local_f8];
      dVar22 = dVar2 - pdVar17[local_f8];
      dVar23 = dVar3 - pdVar18[local_f8];
      dVar24 = sqrt(dVar23 * dVar23 + dVar21 * dVar21 + dVar22 * dVar22);
      dVar25 = 1.0 / dVar24;
      dVar26 = exp(-*(double *)(in_RDI + 0x48) * dVar24);
      dVar24 = dVar25 * 0.079577471545948 * dVar25 * dVar25 *
               (-(*(double *)(in_RDI + 0x40) * dVar26) * (*(double *)(in_RDI + 0x48) * dVar24 + 1.0)
               + 1.0);
      local_d8 = dVar25 * 0.079577471545948 * (1.0 - dVar26) * pdVar19[local_f8] + local_d8;
      local_e0 = dVar24 * pdVar19[local_f8] * dVar21 + local_e0;
      local_e8 = dVar24 * pdVar19[local_f8] * dVar22 + local_e8;
      local_f0 = dVar24 * pdVar19[local_f8] * dVar23 + local_f0;
    }
    *pdVar20 = pdVar15[local_b8 + *(long *)(in_RDI + 0xc0)] * pdVar14[local_b8] * local_d8 +
               pdVar15[local_b8] * pdVar14[local_b8] *
               (pdVar13[local_b8] * local_f0 +
               pdVar11[local_b8] * local_e0 + pdVar12[local_b8] * local_e8) + *pdVar20;
  }
  return;
}

Assistant:

void SolvationEnergyCompute::particle_particle_interact(std::array<std::size_t, 2> target_node_idxs,
                                                        std::array<std::size_t, 2> source_node_idxs)
{
//    timers_.particle_particle_interact.start();

    /* Targets */
    
    std::size_t target_node_begin          = target_node_idxs[0];
    std::size_t target_node_end            = target_node_idxs[1];

    const double* __restrict elem_x_ptr    = elements_.x_ptr();
    const double* __restrict elem_y_ptr    = elements_.y_ptr();
    const double* __restrict elem_z_ptr    = elements_.z_ptr();
    
    const double* __restrict elem_q_dx_ptr = elements_.nx_ptr();
    const double* __restrict elem_q_dy_ptr = elements_.ny_ptr();
    const double* __restrict elem_q_dz_ptr = elements_.nz_ptr();
    
    const double* __restrict elem_area_ptr = elements_.area_ptr();
    const double* __restrict potential_ptr = potential_.data();

    /* Sources */
    
    std::size_t source_node_begin      = source_node_idxs[0];
    std::size_t source_node_end        = source_node_idxs[1];
    
    const double* __restrict mol_x_ptr = molecule_.x_ptr();
    const double* __restrict mol_y_ptr = molecule_.y_ptr();
    const double* __restrict mol_z_ptr = molecule_.z_ptr();

    const double* __restrict mol_q_ptr = molecule_.charge_ptr();

    /* Potential */

    double* __restrict solv_eng_ptr = solv_eng_vec_.data();


#ifdef OPENACC_ENABLED
    int stream_id = std::rand() % 3;
    #pragma acc parallel loop async(stream_id) present(elem_x_ptr, elem_y_ptr, elem_z_ptr, elem_area_ptr, \
                                                       elem_q_dx_ptr, elem_q_dy_ptr, elem_q_dz_ptr, \
                                                       mol_x_ptr, mol_y_ptr, mol_z_ptr, mol_q_ptr, \
                                                       solv_eng_ptr, potential_ptr)
#endif
    for (std::size_t j = target_node_begin; j < target_node_end; ++j) {
        
        double target_x = elem_x_ptr[j];
        double target_y = elem_y_ptr[j];
        double target_z = elem_z_ptr[j];
        
        double pot_temp_dd = 0.;
        double pot_temp_dx = 0.;
        double pot_temp_dy = 0.;
        double pot_temp_dz = 0.;
        
#ifdef OPENACC_ENABLED
        #pragma acc loop reduction(+:pot_temp_dd, pot_temp_dx, \
                                     pot_temp_dy, pot_temp_dz)
#endif
        for (std::size_t k = source_node_begin; k < source_node_end; ++k) {

            double dx = target_x - mol_x_ptr[k];
            double dy = target_y - mol_y_ptr[k];
            double dz = target_z - mol_z_ptr[k];

            double r     = std::sqrt(dx*dx + dy*dy + dz*dz);
            double rinv  = 1. / r;
            double G0    = constants::ONE_OVER_4PI * rinv;
            double expkr = std::exp(-kappa_ * r);
            
            double L2  =  G0 * (1. - expkr);
            double L1  =  G0 * rinv * rinv * (1. - eps_ * expkr * (1. + kappa_ * r));

            pot_temp_dd += L2 * mol_q_ptr[k];
            pot_temp_dx += L1 * mol_q_ptr[k] * dx;
            pot_temp_dy += L1 * mol_q_ptr[k] * dy;
            pot_temp_dz += L1 * mol_q_ptr[k] * dz;
        }
        
        double pot_temp_1 = potential_ptr[j + potential_offset_]
                          * elem_area_ptr[j] * pot_temp_dd;
        double pot_temp_2 = potential_ptr[j] * elem_area_ptr[j]
                         * (elem_q_dx_ptr[j] * pot_temp_dx
                          + elem_q_dy_ptr[j] * pot_temp_dy
                          + elem_q_dz_ptr[j] * pot_temp_dz);

#ifdef OPENACC_ENABLED
        #pragma acc atomic update
#elif  OPENMP_ENABLED
        #pragma omp atomic update
#endif
        solv_eng_ptr[0] += pot_temp_1 + pot_temp_2;
    }

//    timers_.particle_particle_interact.stop();
}